

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O1

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *dir;
  long lVar5;
  cmExecutionStatus *extraout_RDX;
  cmExecutionStatus *extraout_RDX_00;
  cmExecutionStatus *extraout_RDX_01;
  cmExecutionStatus *extraout_RDX_02;
  cmExecutionStatus *extraout_RDX_03;
  cmExecutionStatus *extraout_RDX_04;
  int iVar6;
  ulong uVar7;
  pointer pbVar8;
  _Alloc_hider _Var9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int retVal;
  string command;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string output;
  uint local_144;
  cmCommand *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  string local_d8;
  string local_b8 [3];
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
      operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1);
    }
    bVar14 = false;
  }
  else {
    local_f8 = &local_e8;
    uVar7 = 0;
    local_f0 = 0;
    local_e8 = 0;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar14 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish == pbVar8;
    if (!bVar14) {
      lVar10 = 0;
      uVar11 = 0;
      bVar3 = false;
      bVar12 = false;
      bVar2 = false;
      local_140 = &this->super_cmCommand;
      do {
        iVar4 = std::__cxx11::string::compare((char *)((long)&(pbVar8->_M_dataplus)._M_p + lVar10));
        iVar6 = (int)uVar7;
        if (iVar4 == 0) {
          uVar7 = (ulong)(iVar6 + 1);
          bVar12 = true;
          bVar2 = false;
          param_2 = extraout_RDX;
          goto LAB_003b3323;
        }
        if (bVar12) {
          if (local_118._M_string_length != 0) {
            local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"called with incorrect number of arguments","");
            cmCommand::SetError(local_140,local_b8);
LAB_003b36e7:
            _Var9._M_p = local_b8[0]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) goto LAB_003b35f6;
            goto LAB_003b35fe;
          }
          std::__cxx11::string::_M_assign((string *)&local_118);
          param_2 = extraout_RDX_00;
LAB_003b32cb:
          uVar7 = (ulong)(iVar6 + 1);
          bVar12 = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
          if (iVar4 == 0) {
            bVar3 = true;
            bVar2 = false;
            param_2 = extraout_RDX_01;
            goto LAB_003b32cb;
          }
          if (bVar3) {
            if (local_d8._M_string_length != 0) {
              local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b8,"called with incorrect number of arguments","");
              cmCommand::SetError(local_140,local_b8);
              goto LAB_003b36e7;
            }
            std::__cxx11::string::_M_assign((string *)&local_d8);
            uVar7 = (ulong)(iVar6 + 1);
            param_2 = extraout_RDX_02;
LAB_003b3323:
            bVar3 = false;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar10));
            param_2 = extraout_RDX_03;
            if (iVar4 == 0) {
              uVar7 = (ulong)(iVar6 + 1);
              bVar2 = true;
              bVar12 = false;
              goto LAB_003b3323;
            }
            if (bVar2) {
              std::__cxx11::string::_M_append
                        ((char *)&local_f8,
                         *(ulong *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar10));
              std::__cxx11::string::append((char *)&local_f8);
              uVar7 = (ulong)(iVar6 + 1);
              param_2 = extraout_RDX_04;
            }
          }
        }
        uVar11 = uVar11 + 1;
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x20;
        bVar13 = uVar11 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8
                                 >> 5);
        bVar14 = !bVar13;
      } while (bVar13);
      uVar7 = (ulong)(int)uVar7;
      this = (cmExecProgramCommand *)local_140;
    }
    local_138 = &local_128;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    if (local_f0 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_138);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
                (local_b8,(cmSystemTools *)
                          (((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                 &param_2->ReturnInvoked);
      std::__cxx11::string::operator=((string *)&local_138,(string *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
        operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_138);
      std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8);
    }
    sVar1 = local_118._M_string_length;
    local_144 = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) - uVar7 == 2) {
      cmsys::SystemTools::MakeDirectory(pbVar8[1]._M_dataplus._M_p);
      dir = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    }
    else {
      dir = (char *)0x0;
    }
    bVar3 = RunCommand(local_138->_M_local_buf,&local_50,(int *)&local_144,dir,sVar1 == 0);
    if (!bVar3) {
      local_144 = 0xffffffff;
    }
    if (local_118._M_string_length != 0) {
      uVar7 = std::__cxx11::string::find_first_not_of((char *)&local_50,0x5a6b14,0);
      lVar10 = std::__cxx11::string::find_last_not_of((char *)&local_50,0x5a6b14,0xffffffffffffffff)
      ;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = 0;
      }
      lVar5 = local_50._M_string_length - 1;
      if (lVar10 != -1) {
        lVar5 = lVar10;
      }
      std::__cxx11::string::string((string *)local_b8,(string *)&local_50,uVar7,(lVar5 - uVar7) + 1)
      ;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_118,local_b8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
        operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if (local_d8._M_string_length != 0) {
      sprintf((char *)local_b8,"%d",(ulong)local_144);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_d8,(char *)local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_138 != &local_128) {
      local_b8[0].field_2._0_8_ =
           CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]);
      _Var9._M_p = (pointer)local_138;
LAB_003b35f6:
      operator_delete(_Var9._M_p,local_b8[0].field_2._0_8_ + 1);
    }
LAB_003b35fe:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
    }
  }
  return bVar14;
}

Assistant:

bool cmExecProgramCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "OUTPUT_VARIABLE")
      {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
      }
    else if ( haveoutput_variable )
      {
      if (!output_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      output_variable = args[i];
      haveoutput_variable = false;
      count ++;
      }
    else if(args[i] == "RETURN_VALUE")
      {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
      }
    else if ( havereturn_variable )
      {
      if (!return_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      return_variable = args[i];
      havereturn_variable = false;
      count ++;
      }
    else if(args[i] == "ARGS")
      {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
      }
    else if(doingargs)
      {
      arguments += args[i];
      arguments += " ";
      count++;
      }
    }

  std::string command;
  if(!arguments.empty())
    {
    command = cmSystemTools::ConvertToRunCommandPath(args[0].c_str());
    command += " ";
    command += arguments;
    }
  else
    {
    command = args[0];
    }
  bool verbose = true;
  if(!output_variable.empty())
    {
    verbose = false;
    }
  int retVal = 0;
  std::string output;
  bool result = true;
  if(args.size() - count == 2)
    {
    cmSystemTools::MakeDirectory(args[1].c_str());
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
    }
  else
    {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output,
                                              retVal, 0, verbose);
    }
  if(!result)
    {
    retVal = -1;
    }

  if (!output_variable.empty())
    {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if(first == std::string::npos)
      {
      first = 0;
      }
    if(last == std::string::npos)
      {
      last = output.size()-1;
      }

    std::string coutput = std::string(output, first, last-first+1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
    }

  if (!return_variable.empty())
    {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
    }

  return true;
}